

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingOpenCV.h
# Opt level: O1

void DrawBarcode(Mat *img,Barcode *barcode)

{
  int iVar1;
  initializer_list<cv::Point_<int>_> __l;
  Point_<int> local_c8;
  PointT<int> PStack_c0;
  PointT<int> local_b8;
  PointT<int> PStack_b0;
  PointT<int> local_a8;
  _InputOutputArray local_a0;
  int npts;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  Point_<int> *pts;
  int local_60;
  int local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c8 = *(Point_<int> *)(barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems;
  PStack_c0 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
  local_b8 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
  PStack_b0 = (barcode->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
  iVar1 = PStack_b0.y;
  __l._M_len = 4;
  __l._M_array = &local_c8;
  local_a8 = PStack_b0;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&contour,__l,(allocator_type *)&local_a0);
  pts = contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start;
  npts = (int)((ulong)((long)contour.
                             super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)contour.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_a0.super__OutputArray.super__InputArray.sz.width = 0;
  local_a0.super__OutputArray.super__InputArray.sz.height = 0;
  local_a0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_c8.x = 0;
  local_c8.y = 0;
  local_b8.x = 0;
  local_b8.y = 0;
  PStack_b0.x = 0;
  PStack_b0.y = 0;
  PStack_c0.x = 0;
  PStack_c0.y = 0x406fe000;
  local_a0.super__OutputArray.super__InputArray.obj = img;
  cv::polylines(&local_a0,(Point_ **)&pts,&npts,1,true,(Scalar_ *)&local_c8,1,8,0);
  local_a0.super__OutputArray.super__InputArray.sz.width = 0;
  local_a0.super__OutputArray.super__InputArray.sz.height = 0;
  local_a0.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_a0.super__OutputArray.super__InputArray.obj = img;
  ZXing::Result::text_abi_cxx11_();
  local_5c = iVar1 + 0x14;
  local_60 = local_a8.x;
  local_58 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_50 = 0x406fe00000000000;
  cv::putText(0,&local_a0,&local_c8,&local_60,2,&local_58,1,8,0);
  if (local_c8 != (Point_<int>)&local_b8) {
    operator_delete((void *)local_c8,(long)local_b8 + 1);
  }
  if (contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(contour.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)contour.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)contour.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

inline void DrawBarcode(cv::Mat& img, ZXing::Barcode barcode)
{
	auto pos = barcode.position();
	auto zx2cv = [](ZXing::PointI p) { return cv::Point(p.x, p.y); };
	auto contour = std::vector<cv::Point>{zx2cv(pos[0]), zx2cv(pos[1]), zx2cv(pos[2]), zx2cv(pos[3])};
	const auto* pts = contour.data();
	int npts = contour.size();

	cv::polylines(img, &pts, &npts, 1, true, CV_RGB(0, 255, 0));
	cv::putText(img, barcode.text(), zx2cv(pos[3]) + cv::Point(0, 20), cv::FONT_HERSHEY_DUPLEX, 0.5, CV_RGB(0, 255, 0));
}